

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O1

void __thiscall cmInstallGenerator::GenerateScript(cmInstallGenerator *this,ostream *os)

{
  ostream *poVar1;
  string component_test;
  string local_38;
  
  CreateComponentTest(&local_38,(cmInstallGenerator *)os,&this->Component,this->ExcludeFromAll,
                      this->AllComponents);
  if (local_38._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_38._M_dataplus._M_p,local_38._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
  }
  (*(this->super_cmScriptGenerator)._vptr_cmScriptGenerator[3])
            (this,os,(ulong)((this->AllComponents ^ 1) * 2));
  if (local_38._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n\n",9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  std::string component_test = this->CreateComponentTest(
    this->Component, this->ExcludeFromAll, this->AllComponents);

  // Begin this block of installation.
  if (!component_test.empty()) {
    os << indent << "if(" << component_test << ")\n";
  }

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os,
                              this->AllComponents ? indent : indent.Next());

  // End this block of installation.
  if (!component_test.empty()) {
    os << indent << "endif()\n\n";
  }
}